

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

string * __thiscall
pfederc::ArrayCpyExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ArrayCpyExpr *this)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  long *local_c0;
  ulong local_b8;
  long local_b0;
  undefined8 uStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  (*((this->valueExpr)._M_t.
     super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(local_40);
  plVar2 = (long *)std::__cxx11::string::insert((ulong)local_40,0,'\x01');
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_90 = *puVar5;
    uStack_88 = (undefined4)plVar2[3];
    uStack_84 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar5;
    local_a0 = (ulong *)*plVar2;
  }
  local_98 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (*((this->lengthExpr)._M_t.
     super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_80);
  uVar7 = 0xf;
  if (local_a0 != &local_90) {
    uVar7 = local_90;
  }
  if (uVar7 < (ulong)(local_78 + local_98)) {
    uVar7 = 0xf;
    if (local_80 != local_70) {
      uVar7 = local_70[0];
    }
    if ((ulong)(local_78 + local_98) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0011ce55;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
LAB_0011ce55:
  local_c0 = &local_b0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_b0 = *plVar2;
    uStack_a8 = puVar3[3];
  }
  else {
    local_b0 = *plVar2;
    local_c0 = (long *)*puVar3;
  }
  local_b8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_c0,local_b8,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayCpyExpr::toString() const noexcept {
  return '[' + valueExpr->toString() + "; " + lengthExpr->toString() + ']';
}